

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection.cpp
# Opt level: O3

void __thiscall glslang::TReflection::dump(TReflection *this)

{
  pointer pTVar1;
  ulong uVar2;
  long lVar3;
  
  puts("Uniform reflection:");
  pTVar1 = (this->indexToUniform).
           super__Vector_base<glslang::TObjectReflection,_std::allocator<glslang::TObjectReflection>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->indexToUniform).
      super__Vector_base<glslang::TObjectReflection,_std::allocator<glslang::TObjectReflection>_>.
      _M_impl.super__Vector_impl_data._M_finish != pTVar1) {
    lVar3 = 0;
    uVar2 = 0;
    do {
      TObjectReflection::dump((TObjectReflection *)((long)&(pTVar1->name)._M_dataplus._M_p + lVar3))
      ;
      uVar2 = uVar2 + 1;
      pTVar1 = (this->indexToUniform).
               super__Vector_base<glslang::TObjectReflection,_std::allocator<glslang::TObjectReflection>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar3 = lVar3 + 0x50;
    } while (uVar2 < (ulong)(((long)(this->indexToUniform).
                                    super__Vector_base<glslang::TObjectReflection,_std::allocator<glslang::TObjectReflection>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)pTVar1 >> 4)
                            * -0x3333333333333333));
  }
  putchar(10);
  puts("Uniform block reflection:");
  pTVar1 = (this->indexToUniformBlock).
           super__Vector_base<glslang::TObjectReflection,_std::allocator<glslang::TObjectReflection>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->indexToUniformBlock).
      super__Vector_base<glslang::TObjectReflection,_std::allocator<glslang::TObjectReflection>_>.
      _M_impl.super__Vector_impl_data._M_finish != pTVar1) {
    lVar3 = 0;
    uVar2 = 0;
    do {
      TObjectReflection::dump((TObjectReflection *)((long)&(pTVar1->name)._M_dataplus._M_p + lVar3))
      ;
      uVar2 = uVar2 + 1;
      pTVar1 = (this->indexToUniformBlock).
               super__Vector_base<glslang::TObjectReflection,_std::allocator<glslang::TObjectReflection>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar3 = lVar3 + 0x50;
    } while (uVar2 < (ulong)(((long)(this->indexToUniformBlock).
                                    super__Vector_base<glslang::TObjectReflection,_std::allocator<glslang::TObjectReflection>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)pTVar1 >> 4)
                            * -0x3333333333333333));
  }
  putchar(10);
  puts("Buffer variable reflection:");
  pTVar1 = (this->indexToBufferVariable).
           super__Vector_base<glslang::TObjectReflection,_std::allocator<glslang::TObjectReflection>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->indexToBufferVariable).
      super__Vector_base<glslang::TObjectReflection,_std::allocator<glslang::TObjectReflection>_>.
      _M_impl.super__Vector_impl_data._M_finish != pTVar1) {
    lVar3 = 0;
    uVar2 = 0;
    do {
      TObjectReflection::dump((TObjectReflection *)((long)&(pTVar1->name)._M_dataplus._M_p + lVar3))
      ;
      uVar2 = uVar2 + 1;
      pTVar1 = (this->indexToBufferVariable).
               super__Vector_base<glslang::TObjectReflection,_std::allocator<glslang::TObjectReflection>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar3 = lVar3 + 0x50;
    } while (uVar2 < (ulong)(((long)(this->indexToBufferVariable).
                                    super__Vector_base<glslang::TObjectReflection,_std::allocator<glslang::TObjectReflection>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)pTVar1 >> 4)
                            * -0x3333333333333333));
  }
  putchar(10);
  puts("Buffer block reflection:");
  pTVar1 = (this->indexToBufferBlock).
           super__Vector_base<glslang::TObjectReflection,_std::allocator<glslang::TObjectReflection>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->indexToBufferBlock).
      super__Vector_base<glslang::TObjectReflection,_std::allocator<glslang::TObjectReflection>_>.
      _M_impl.super__Vector_impl_data._M_finish != pTVar1) {
    lVar3 = 0;
    uVar2 = 0;
    do {
      TObjectReflection::dump((TObjectReflection *)((long)&(pTVar1->name)._M_dataplus._M_p + lVar3))
      ;
      uVar2 = uVar2 + 1;
      pTVar1 = (this->indexToBufferBlock).
               super__Vector_base<glslang::TObjectReflection,_std::allocator<glslang::TObjectReflection>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar3 = lVar3 + 0x50;
    } while (uVar2 < (ulong)(((long)(this->indexToBufferBlock).
                                    super__Vector_base<glslang::TObjectReflection,_std::allocator<glslang::TObjectReflection>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)pTVar1 >> 4)
                            * -0x3333333333333333));
  }
  putchar(10);
  puts("Pipeline input reflection:");
  pTVar1 = (this->indexToPipeInput).
           super__Vector_base<glslang::TObjectReflection,_std::allocator<glslang::TObjectReflection>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->indexToPipeInput).
      super__Vector_base<glslang::TObjectReflection,_std::allocator<glslang::TObjectReflection>_>.
      _M_impl.super__Vector_impl_data._M_finish != pTVar1) {
    lVar3 = 0;
    uVar2 = 0;
    do {
      TObjectReflection::dump((TObjectReflection *)((long)&(pTVar1->name)._M_dataplus._M_p + lVar3))
      ;
      uVar2 = uVar2 + 1;
      pTVar1 = (this->indexToPipeInput).
               super__Vector_base<glslang::TObjectReflection,_std::allocator<glslang::TObjectReflection>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar3 = lVar3 + 0x50;
    } while (uVar2 < (ulong)(((long)(this->indexToPipeInput).
                                    super__Vector_base<glslang::TObjectReflection,_std::allocator<glslang::TObjectReflection>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)pTVar1 >> 4)
                            * -0x3333333333333333));
  }
  putchar(10);
  puts("Pipeline output reflection:");
  pTVar1 = (this->indexToPipeOutput).
           super__Vector_base<glslang::TObjectReflection,_std::allocator<glslang::TObjectReflection>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->indexToPipeOutput).
      super__Vector_base<glslang::TObjectReflection,_std::allocator<glslang::TObjectReflection>_>.
      _M_impl.super__Vector_impl_data._M_finish != pTVar1) {
    lVar3 = 0;
    uVar2 = 0;
    do {
      TObjectReflection::dump((TObjectReflection *)((long)&(pTVar1->name)._M_dataplus._M_p + lVar3))
      ;
      uVar2 = uVar2 + 1;
      pTVar1 = (this->indexToPipeOutput).
               super__Vector_base<glslang::TObjectReflection,_std::allocator<glslang::TObjectReflection>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar3 = lVar3 + 0x50;
    } while (uVar2 < (ulong)(((long)(this->indexToPipeOutput).
                                    super__Vector_base<glslang::TObjectReflection,_std::allocator<glslang::TObjectReflection>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)pTVar1 >> 4)
                            * -0x3333333333333333));
  }
  putchar(10);
  if (1 < this->localSize[0]) {
    lVar3 = 0;
    do {
      if (1 < *(uint *)((long)this->localSize + lVar3)) {
        printf("Local size %s: %u\n",
               (long)&_ZZN7glslang11TReflection4dumpEvE4axis_rel +
               (long)*(int *)((long)&_ZZN7glslang11TReflection4dumpEvE4axis_rel + lVar3));
      }
      lVar3 = lVar3 + 4;
    } while (lVar3 != 0xc);
    putchar(10);
    return;
  }
  return;
}

Assistant:

void TReflection::dump()
{
    printf("Uniform reflection:\n");
    for (size_t i = 0; i < indexToUniform.size(); ++i)
        indexToUniform[i].dump();
    printf("\n");

    printf("Uniform block reflection:\n");
    for (size_t i = 0; i < indexToUniformBlock.size(); ++i)
        indexToUniformBlock[i].dump();
    printf("\n");

    printf("Buffer variable reflection:\n");
    for (size_t i = 0; i < indexToBufferVariable.size(); ++i)
      indexToBufferVariable[i].dump();
    printf("\n");

    printf("Buffer block reflection:\n");
    for (size_t i = 0; i < indexToBufferBlock.size(); ++i)
      indexToBufferBlock[i].dump();
    printf("\n");

    printf("Pipeline input reflection:\n");
    for (size_t i = 0; i < indexToPipeInput.size(); ++i)
        indexToPipeInput[i].dump();
    printf("\n");

    printf("Pipeline output reflection:\n");
    for (size_t i = 0; i < indexToPipeOutput.size(); ++i)
        indexToPipeOutput[i].dump();
    printf("\n");

    if (getLocalSize(0) > 1) {
        static const char* axis[] = { "X", "Y", "Z" };

        for (int dim=0; dim<3; ++dim)
            if (getLocalSize(dim) > 1)
                printf("Local size %s: %u\n", axis[dim], getLocalSize(dim));

        printf("\n");
    }

    // printf("Live names\n");
    // for (TNameToIndex::const_iterator it = nameToIndex.begin(); it != nameToIndex.end(); ++it)
    //    printf("%s: %d\n", it->first.c_str(), it->second);
    // printf("\n");
}